

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O2

closure * closure_uniprocessor_check
                    (_func_void_closure_t_uniprocessor_check_0_closure_t_uniprocessor_check_1 *f,
                    closure_t_uniprocessor_check_0 a0,closure_t_uniprocessor_check_1 a1)

{
  closure *pcVar1;
  
  pcVar1 = (closure *)malloc(0x20);
  pcVar1->f0 = closure_f0_uniprocessor_check;
  pcVar1[1].f0 = uniprocessor_check;
  pcVar1[2].f0 = (_func_void_void_ptr *)f;
  pcVar1[3].f0 = (_func_void_void_ptr *)a0;
  return pcVar1;
}

Assistant:

static void uniprocessor_check (nsync_atomic_uint32_ *state, struct is_uniprocessor_s *s) {
	IGNORE_RACES_START ();
	while (ATM_LOAD_ACQ (state) != 1) {
	}
	while (ATM_LOAD_ACQ (state) == 1) {
		s->count++;
	}
	ATM_STORE_REL (&s->done, 1);
	IGNORE_RACES_END ();
}